

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

quint16 toWindowsIdKey(QByteArray *winId)

{
  bool bVar1;
  quint16 qVar2;
  WindowsData *this;
  long in_FS_OFFSET;
  QByteArrayView local_40;
  QByteArrayView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this = std::
         __lower_bound<QtTimeZoneCldr::WindowsData_const*,QByteArray,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(QtTimeZoneCldr::WindowsData,QByteArrayView)noexcept>>
                   ((WindowsData *)&QtTimeZoneCldr::windowsDataTable,(WindowsData *)&DAT_00533ed4,
                    winId,(_Iter_comp_val<bool_(*)(QtTimeZoneCldr::WindowsData,_QByteArrayView)_noexcept>
                           )0x3ac50d);
  if (this != (WindowsData *)&DAT_00533ed4) {
    local_30 = QtTimeZoneCldr::WindowsData::windowsId(this);
    local_40.m_data = (winId->d).ptr;
    local_40.m_size = (winId->d).size;
    bVar1 = comparesEqual(&local_30,&local_40);
    if (bVar1) {
      qVar2 = this->windowsIdKey;
      goto LAB_003ac9bd;
    }
  }
  qVar2 = 0;
LAB_003ac9bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

static quint16 toWindowsIdKey(const QByteArray &winId)
{
    // Key and winId are monotonic, table is sorted on them.
    const auto data = std::lower_bound(std::begin(windowsDataTable), std::end(windowsDataTable),
                                       winId, earlierWindowsId);
    if (data != std::end(windowsDataTable) && data->windowsId() == winId)
        return data->windowsIdKey;
    return 0;
}